

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flv_read_tag(FILE *flv,flvtag_t *tag)

{
  uint8_t *puVar1;
  uint uVar2;
  size_t sVar3;
  undefined1 local_2f;
  byte bStack_2e;
  byte bStack_2d;
  byte bStack_2c;
  undefined4 uStack_2b;
  uint8_t h [11];
  uint32_t size;
  flvtag_t *tag_local;
  FILE *flv_local;
  
  unique0x1000009c = tag;
  sVar3 = fread(&local_2f,1,0xb,(FILE *)flv);
  if (sVar3 == 0xb) {
    h._3_4_ = (uint)bStack_2e << 0x10 | (uint)bStack_2d << 8 | (uint)bStack_2c;
    flvtag_reserve(stack0xffffffffffffffe0,h._3_4_);
    puVar1 = stack0xffffffffffffffe0->data;
    *(ulong *)puVar1 =
         CONCAT44(uStack_2b,CONCAT13(bStack_2c,CONCAT12(bStack_2d,CONCAT11(bStack_2e,local_2f))));
    *(undefined2 *)(puVar1 + 8) = h._0_2_;
    puVar1[10] = h[2];
    uVar2 = h._3_4_ + 4;
    sVar3 = fread(stack0xffffffffffffffe0->data + 0xb,1,(ulong)(h._3_4_ + 4),(FILE *)flv);
    if (uVar2 == sVar3) {
      flv_local._4_4_ = 1;
    }
    else {
      flv_local._4_4_ = 0;
    }
  }
  else {
    flv_local._4_4_ = 0;
  }
  return flv_local._4_4_;
}

Assistant:

int flv_read_tag(FILE* flv, flvtag_t* tag)
{
    uint32_t size;
    uint8_t h[FLV_TAG_HEADER_SIZE];

    if (FLV_TAG_HEADER_SIZE != fread(&h[0], 1, FLV_TAG_HEADER_SIZE, flv)) {
        return 0;
    }

    size = ((h[1] << 16) | (h[2] << 8) | h[3]);
    flvtag_reserve(tag, size);
    // copy header to buffer
    memcpy(tag->data, &h[0], FLV_TAG_HEADER_SIZE);

    if (size + FLV_TAG_FOOTER_SIZE != fread(&tag->data[FLV_TAG_HEADER_SIZE], 1, size + FLV_TAG_FOOTER_SIZE, flv)) {
        return 0;
    }

    return 1;
}